

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

uint If_CluGrp2Uns(If_Grp_t *pG)

{
  uint uVar1;
  long lVar2;
  char *pChar;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
    uVar1 = uVar1 | ((byte)pG->nVars & 0xf) << ((byte)lVar2 & 0x1f);
    pG = (If_Grp_t *)&pG->nMyu;
  }
  return uVar1;
}

Assistant:

static inline unsigned If_CluGrp2Uns( If_Grp_t * pG )
{
    char * pChar = (char *)pG;
    unsigned Res = 0;
    int i;
    for ( i = 0; i < 8; i++ )
        Res |= ((pChar[i] & 15) << (i << 2));
    return Res;
}